

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbi.cpp
# Opt level: O2

LanguageBreakEngine * __thiscall
icu_63::RuleBasedBreakIterator::getLanguageBreakEngine(RuleBasedBreakIterator *this,UChar32 c)

{
  code *pcVar1;
  uint in_EAX;
  int iVar2;
  LanguageBreakEngine *pLVar3;
  UStack *this_00;
  long *plVar4;
  UnhandledEngine *pUVar5;
  undefined4 in_register_00000034;
  code *size;
  int32_t iVar6;
  ulong uStack_28;
  UErrorCode status;
  
  uStack_28 = (ulong)in_EAX;
  pcVar1 = (code *)(ulong)(uint)c;
  this_00 = this->fLanguageBreakEngines;
  if (this_00 == (UStack *)0x0) {
    this_00 = (UStack *)UMemory::operator_new((UMemory *)0x28,CONCAT44(in_register_00000034,c));
    if (this_00 == (UStack *)0x0) {
      this->fLanguageBreakEngines = (UStack *)0x0;
    }
    else {
      UStack::UStack(this_00,&status);
      this->fLanguageBreakEngines = this_00;
      if (status < U_ILLEGAL_ARGUMENT_ERROR) goto LAB_00285aad;
      (*(this_00->super_UVector).super_UObject._vptr_UObject[1])(this_00);
    }
    this->fLanguageBreakEngines = (UStack *)0x0;
  }
  else {
LAB_00285aad:
    iVar6 = (this_00->super_UVector).count;
    while (0 < iVar6) {
      iVar6 = iVar6 + -1;
      pLVar3 = (LanguageBreakEngine *)
               UVector::elementAt(&this->fLanguageBreakEngines->super_UVector,iVar6);
      iVar2 = (*pLVar3->_vptr_LanguageBreakEngine[2])(pLVar3,pcVar1);
      if ((char)iVar2 != '\0') {
        return pLVar3;
      }
    }
    size = initLanguageFactories;
    umtx_initOnce(&gLanguageBreakFactoriesInitOnce,initLanguageFactories);
    if (gLanguageBreakFactories != (UStack *)0x0) {
      iVar6 = (gLanguageBreakFactories->super_UVector).count;
      while (0 < iVar6) {
        iVar6 = iVar6 + -1;
        plVar4 = (long *)UVector::elementAt(&gLanguageBreakFactories->super_UVector,iVar6);
        size = pcVar1;
        pLVar3 = (LanguageBreakEngine *)(**(code **)(*plVar4 + 0x10))(plVar4);
        if (pLVar3 != (LanguageBreakEngine *)0x0) {
          UVector::addElement(&this->fLanguageBreakEngines->super_UVector,pLVar3,&status);
          return pLVar3;
        }
      }
    }
    pUVar5 = this->fUnhandledBreakEngine;
    if (pUVar5 != (UnhandledEngine *)0x0) {
LAB_00285b8b:
      (*(pUVar5->super_LanguageBreakEngine)._vptr_LanguageBreakEngine[4])(pUVar5,pcVar1);
      return &this->fUnhandledBreakEngine->super_LanguageBreakEngine;
    }
    pUVar5 = (UnhandledEngine *)UMemory::operator_new((UMemory *)0x10,(size_t)size);
    if (pUVar5 != (UnhandledEngine *)0x0) {
      UnhandledEngine::UnhandledEngine(pUVar5,&status);
    }
    this->fUnhandledBreakEngine = pUVar5;
    if ((pUVar5 != (UnhandledEngine *)0x0) || (U_ZERO_ERROR < status)) {
      UVector::insertElementAt(&this->fLanguageBreakEngines->super_UVector,pUVar5,0,&status);
      pUVar5 = this->fUnhandledBreakEngine;
      if (status < U_ILLEGAL_ARGUMENT_ERROR) goto LAB_00285b8b;
      if (pUVar5 != (UnhandledEngine *)0x0) {
        (*(pUVar5->super_LanguageBreakEngine)._vptr_LanguageBreakEngine[1])();
      }
      this->fUnhandledBreakEngine = (UnhandledEngine *)0x0;
    }
  }
  return (LanguageBreakEngine *)0x0;
}

Assistant:

const LanguageBreakEngine *
RuleBasedBreakIterator::getLanguageBreakEngine(UChar32 c) {
    const LanguageBreakEngine *lbe = NULL;
    UErrorCode status = U_ZERO_ERROR;

    if (fLanguageBreakEngines == NULL) {
        fLanguageBreakEngines = new UStack(status);
        if (fLanguageBreakEngines == NULL || U_FAILURE(status)) {
            delete fLanguageBreakEngines;
            fLanguageBreakEngines = 0;
            return NULL;
        }
    }

    int32_t i = fLanguageBreakEngines->size();
    while (--i >= 0) {
        lbe = (const LanguageBreakEngine *)(fLanguageBreakEngines->elementAt(i));
        if (lbe->handles(c)) {
            return lbe;
        }
    }

    // No existing dictionary took the character. See if a factory wants to
    // give us a new LanguageBreakEngine for this character.
    lbe = getLanguageBreakEngineFromFactory(c);

    // If we got one, use it and push it on our stack.
    if (lbe != NULL) {
        fLanguageBreakEngines->push((void *)lbe, status);
        // Even if we can't remember it, we can keep looking it up, so
        // return it even if the push fails.
        return lbe;
    }

    // No engine is forthcoming for this character. Add it to the
    // reject set. Create the reject break engine if needed.
    if (fUnhandledBreakEngine == NULL) {
        fUnhandledBreakEngine = new UnhandledEngine(status);
        if (U_SUCCESS(status) && fUnhandledBreakEngine == NULL) {
            status = U_MEMORY_ALLOCATION_ERROR;
            return nullptr;
        }
        // Put it last so that scripts for which we have an engine get tried
        // first.
        fLanguageBreakEngines->insertElementAt(fUnhandledBreakEngine, 0, status);
        // If we can't insert it, or creation failed, get rid of it
        if (U_FAILURE(status)) {
            delete fUnhandledBreakEngine;
            fUnhandledBreakEngine = 0;
            return NULL;
        }
    }

    // Tell the reject engine about the character; at its discretion, it may
    // add more than just the one character.
    fUnhandledBreakEngine->handleCharacter(c);

    return fUnhandledBreakEngine;
}